

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_parser.c
# Opt level: O3

RK_S32 av1d_split_frame(Av1CodecContext *ctx,RK_U8 **out_data,RK_S32 *out_size,RK_U8 *data,
                       RK_S32 size)

{
  uint uVar1;
  RK_U32 RVar2;
  RK_U8 *pRVar3;
  int iVar4;
  AV1OBU obu;
  AV1OBU local_b8;
  
  if (((byte)av1d_debug & 1) != 0) {
    _mpp_log_l(4,"av1d_parser","enter ctx %p\n","av1d_split_frame",ctx);
  }
  *out_data = data;
  iVar4 = (int)data;
  if (0 < size) {
    pRVar3 = data + size;
    do {
      uVar1 = av1_extract_obu(&local_b8,data,size);
      if ((int)uVar1 < 0) break;
      if ((uint)local_b8.type < 7) {
        if ((0x26U >> (local_b8.type & 0x1fU) & 1) == 0) {
          if ((0x48U >> (local_b8.type & 0x1fU) & 1) == 0) goto LAB_001bce08;
LAB_001bcdf6:
          RVar2 = ctx->frame_header + 1;
          ctx->frame_header = RVar2;
          goto LAB_001bce0f;
        }
        if (ctx->frame_header != 0) goto LAB_001bcdf6;
      }
      else {
LAB_001bce08:
        RVar2 = ctx->frame_header;
LAB_001bce0f:
        if (RVar2 == 2) {
LAB_001bce35:
          iVar4 = (int)data - iVar4;
          *out_size = iVar4;
          ctx->frame_header = 0;
          ctx->new_frame = 1;
          return iVar4;
        }
        if (local_b8.type == 6) {
          data = (RK_U8 *)(ulong)((int)data + uVar1);
          goto LAB_001bce35;
        }
      }
      data = data + uVar1;
      size = size - uVar1;
    } while (data < pRVar3);
  }
  iVar4 = (int)data - iVar4;
  *out_size = iVar4;
  return iVar4;
}

Assistant:

RK_S32 av1d_split_frame(Av1CodecContext *ctx,
                        RK_U8 **out_data, RK_S32 *out_size,
                        RK_U8 *data, RK_S32 size)
{
    (void)out_data;
    (void)out_size;

    AV1OBU obu;
    uint8_t *ptr = data, *end = data + size;
    av1d_dbg_func("enter ctx %p\n", ctx);

    *out_data = data;

    while (ptr < end) {
        RK_S32 len = av1_extract_obu(&obu, ptr, size);
        if (len < 0)
            break;
        if (obu.type == AV1_OBU_FRAME_HEADER || obu.type == AV1_OBU_FRAME ||
            ((obu.type == AV1_OBU_TEMPORAL_DELIMITER || obu.type == AV1_OBU_METADATA ||
              obu.type == AV1_OBU_SEQUENCE_HEADER) && ctx->frame_header))
            ctx->frame_header ++;
        if (ctx->frame_header == 2) {
            *out_size = (RK_S32)(ptr - data);
            ctx->new_frame = 1;
            ctx->frame_header = 0;
            return ptr - data;
        }
        if (obu.type == AV1_OBU_FRAME) {
            ptr      += len;
            size     -= len;
            *out_size = (RK_S32)(ptr - data);
            ctx->new_frame = 1;
            ctx->frame_header = 0;
            return ptr - data;
        }
        ptr      += len;
        size -= len;
    }

    *out_size = (RK_S32)(ptr - data);

    return ptr - data;

    av1d_dbg_func("leave ctx %p\n", ctx);

    return 0;
}